

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O3

Attribute __thiscall
cali::Caliper::create_attribute
          (Caliper *this,string *name,cali_attr_type type,int prop,int n_meta,Attribute *meta_attr,
          Variant *meta_val)

{
  siglock *psVar1;
  ThreadData *pTVar2;
  ThreadData *this_00;
  GlobalData *pGVar3;
  _Base_ptr __n;
  pointer pcVar4;
  pointer pCVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  cali_variant_t *pcVar8;
  _Bool _Var9;
  int iVar10;
  iterator iVar11;
  Node *pNVar12;
  iterator iVar13;
  long lVar14;
  Attribute AVar15;
  ulong uVar16;
  Node *pNVar17;
  Channel *channel;
  pointer pCVar18;
  ulong uVar19;
  _Rb_tree_color _Var20;
  pthread_mutex_t *__mutex;
  cali_variant_t lhs;
  cali_variant_t rhs;
  Attribute name_attr;
  Attribute prop_attr;
  Attribute local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>
  local_68;
  Attribute local_40;
  Attribute local_38;
  
  __mutex = (pthread_mutex_t *)this->sG;
  if (__mutex == (pthread_mutex_t *)0x0) {
    __assert_fail("sG != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/Caliper.cpp"
                  ,0x2a4,
                  "virtual Attribute cali::Caliper::create_attribute(const std::string &, cali_attr_type, int, int, const Attribute *, const Variant *)"
                 );
  }
  pTVar2 = this->sT;
  psVar1 = &pTVar2->lock;
  psVar1->m_lock = psVar1->m_lock + 1;
  iVar10 = pthread_mutex_lock(__mutex);
  if (iVar10 != 0) {
    std::__throw_system_error(iVar10);
  }
  iVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>_>_>
           ::find(&(this->sG->attribute_map)._M_t,name);
  if ((_Rb_tree_header *)iVar11._M_node ==
      &(this->sG->attribute_map)._M_t._M_impl.super__Rb_tree_header) {
    pthread_mutex_unlock(__mutex);
    pNVar12 = *(Node **)((long)internal::MetadataTree::mG._M_b._M_p + 0x78 + (ulong)type * 8);
    if (0 < n_meta) {
      uVar19 = (ulong)(uint)n_meta;
      do {
        pNVar12 = internal::MetadataTree::get_child(&this->sT->tree,meta_attr,meta_val,pNVar12);
        meta_val = meta_val + 1;
        meta_attr = meta_attr + 1;
        uVar19 = uVar19 - 1;
      } while (uVar19 != 0);
    }
    iVar13 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find(&(this->sG->attribute_prop_presets)._M_t,name);
    if ((_Rb_tree_header *)iVar13._M_node !=
        &(this->sG->attribute_prop_presets)._M_t._M_impl.super__Rb_tree_header) {
      prop = iVar13._M_node[2]._M_color;
    }
    _Var20 = prop & 0xfffffbc3 | 0x40c;
    if (((uint)prop >> 9 & 1) == 0) {
      _Var20 = prop;
    }
    pNVar17 = pNVar12;
    if ((_Var20 & 0x3c) == _S_red) {
      _Var20 = _Var20 | this->sG->attribute_default_scope;
    }
    for (; pNVar17 != (Node *)0x0;
        pNVar17 = *(Node **)((long)&(((pNVar17->super_LockfreeIntrusiveTree<cali::Node>).m_me)->
                                    super_LockfreeIntrusiveTree<cali::Node>).m_me +
                            (pNVar17->super_LockfreeIntrusiveTree<cali::Node>).m_node)) {
      if (((pNVar17->m_attribute == cali_class_aggregatable_attr_id) &&
          ((pNVar17->m_data).m_v.type_and_size == 7)) &&
         (lhs.value.v_uint = (pNVar17->m_data).m_v.value.v_uint, lhs.type_and_size = 7,
         rhs.value.v_uint = 1, rhs.type_and_size = 7, _Var9 = _cali_variant_value_eq(lhs,rhs), _Var9
         )) {
        _Var20 = _Var20 | 0x800;
        break;
      }
    }
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(ulong *)((long)internal::MetadataTree::mG._M_b._M_p + 0x70);
    auVar7 = ZEXT816(0) << 0x40 | ZEXT816(8);
    uVar19 = SUB168(auVar7 / auVar6,0);
    uVar16 = SUB168(auVar7 % auVar6,0);
    pNVar17 = (Node *)0x0;
    if (uVar19 < *(ulong *)((long)internal::MetadataTree::mG._M_b._M_p + 0x68)) {
      lVar14 = uVar19 * 0x10;
      if (uVar16 < *(ulong *)(*(long *)((long)internal::MetadataTree::mG._M_b._M_p + 0x60) + 8 +
                             lVar14)) {
        pNVar17 = (Node *)(uVar16 * 0x48 +
                          *(long *)(*(long *)((long)internal::MetadataTree::mG._M_b._M_p + 0x60) +
                                   lVar14));
      }
      else {
        pNVar17 = (Node *)0x0;
      }
    }
    local_40 = Attribute::make_attribute(pNVar17);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *(ulong *)((long)internal::MetadataTree::mG._M_b._M_p + 0x70);
    auVar6 = ZEXT816(0) << 0x40 | ZEXT816(10);
    uVar19 = SUB168(auVar6 / auVar7,0);
    uVar16 = SUB168(auVar6 % auVar7,0);
    pNVar17 = (Node *)0x0;
    if (uVar19 < *(ulong *)((long)internal::MetadataTree::mG._M_b._M_p + 0x68)) {
      lVar14 = uVar19 * 0x10;
      if (uVar16 < *(ulong *)(*(long *)((long)internal::MetadataTree::mG._M_b._M_p + 0x60) + 8 +
                             lVar14)) {
        pNVar17 = (Node *)(uVar16 * 0x48 +
                          *(long *)(*(long *)((long)internal::MetadataTree::mG._M_b._M_p + 0x60) +
                                   lVar14));
      }
      else {
        pNVar17 = (Node *)0x0;
      }
    }
    local_38 = Attribute::make_attribute(pNVar17);
    local_68.first._M_string_length = (long)(int)_Var20;
    local_68.first._M_dataplus._M_p = (pointer)0x2;
    pNVar12 = internal::MetadataTree::get_child
                        (&this->sT->tree,&local_38,(Variant *)&local_68,pNVar12);
    this_00 = this->sT;
    local_68.first._0_16_ =
         cali_make_variant(CALI_TYPE_STRING,(name->_M_dataplus)._M_p,name->_M_string_length);
    pNVar12 = internal::MetadataTree::get_child
                        (&this_00->tree,&local_40,(Variant *)&local_68,pNVar12);
    __mutex = (pthread_mutex_t *)this->sG;
    iVar10 = pthread_mutex_lock(__mutex);
    if (iVar10 != 0) {
      std::__throw_system_error(iVar10);
    }
    pGVar3 = this->sG;
    iVar11 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>_>_>
             ::_M_lower_bound(&(pGVar3->attribute_map)._M_t,
                              (_Link_type)
                              (pGVar3->attribute_map)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_parent,
                              &(pGVar3->attribute_map)._M_t._M_impl.super__Rb_tree_header._M_header,
                              name);
    pGVar3 = this->sG;
    if ((((_Rb_tree_header *)iVar11._M_node ==
          &(pGVar3->attribute_map)._M_t._M_impl.super__Rb_tree_header) ||
        (__n = iVar11._M_node[1]._M_parent, __n != (_Base_ptr)name->_M_string_length)) ||
       ((__n != (_Base_ptr)0x0 &&
        (iVar10 = bcmp(*(void **)(iVar11._M_node + 1),(name->_M_dataplus)._M_p,(size_t)__n),
        iVar10 != 0)))) {
      AVar15 = Attribute::make_attribute(pNVar12);
      pcVar8 = (cali_variant_t *)&local_68.first.field_2;
      local_68.first._M_dataplus._M_p = (pointer)pcVar8;
      pcVar4 = (name->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar4,pcVar4 + name->_M_string_length);
      local_68.second = AVar15;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cali::Attribute>,std::_Select1st<std::pair<std::__cxx11::string_const,cali::Attribute>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cali::Attribute>>>
      ::_M_emplace_hint_unique<std::pair<std::__cxx11::string,cali::Attribute>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cali::Attribute>,std::_Select1st<std::pair<std::__cxx11::string_const,cali::Attribute>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cali::Attribute>>>
                  *)&pGVar3->attribute_map,(const_iterator)iVar11._M_node,&local_68);
      if ((cali_variant_t *)local_68.first._M_dataplus._M_p != pcVar8) {
        operator_delete(local_68.first._M_dataplus._M_p,
                        local_68.first.field_2._M_allocated_capacity + 1);
      }
      pthread_mutex_unlock(__mutex);
      local_70 = Attribute::make_attribute(pNVar12);
      pCVar18 = (this->sG->all_channels).
                super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
                super__Vector_impl_data._M_start;
      pCVar5 = (this->sG->all_channels).
               super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pCVar18 != pCVar5) {
        do {
          local_68.first._M_dataplus._M_p = (pointer)this;
          util::callback<void(cali::Caliper*,cali::Attribute_const&)>::operator()
                    (&((pCVar18->mP).
                       super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      events,(Caliper **)&local_68,&local_70);
          pCVar18 = pCVar18 + 1;
        } while (pCVar18 != pCVar5);
      }
      goto LAB_001ddc85;
    }
    pNVar12 = *(Node **)(iVar11._M_node + 2);
  }
  else {
    pNVar12 = *(Node **)(iVar11._M_node + 2);
  }
  pthread_mutex_unlock(__mutex);
  local_70.m_node = pNVar12;
LAB_001ddc85:
  psVar1 = &pTVar2->lock;
  psVar1->m_lock = psVar1->m_lock + -1;
  return (Attribute)local_70.m_node;
}

Assistant:

Attribute Caliper::create_attribute(
    const std::string& name,
    cali_attr_type     type,
    int                prop,
    int                n_meta,
    const Attribute*   meta_attr,
    const Variant*     meta_val
)
{
    assert(sG != 0);

    std::lock_guard<::siglock> g(sT->lock);

    // Check if an attribute with this name already exists
    {
        std::lock_guard<std::mutex> ga(sG->attribute_lock);

        auto it = sG->attribute_map.find(name);
        if (it != sG->attribute_map.end())
            return it->second;
    }

    Node* node = nullptr;

    // Get type node
    node = sT->tree.type_node(type);

    // Add metadata nodes.
    for (int n = 0; n < n_meta; ++n)
        node = sT->tree.get_child(meta_attr[n], meta_val[n], node);

    // Look for attribute properties in presets
    auto propit = sG->attribute_prop_presets.find(name);
    if (propit != sG->attribute_prop_presets.end())
        prop = propit->second;

    // Set scope to PROCESS for all global attributes and mark them as unaligned
    if (prop & CALI_ATTR_GLOBAL) {
        prop &= ~CALI_ATTR_SCOPE_MASK;
        prop |= CALI_ATTR_SCOPE_PROCESS;
        prop |= CALI_ATTR_UNALIGNED;
    }
    // Set scope to default scope if none is set
    if ((prop & CALI_ATTR_SCOPE_MASK) == 0)
        prop |= sG->attribute_default_scope;

    // Set CALI_ATTR_AGGREGATABLE property if class.aggregatable metadata is set
    for (const Node* tmp = node; tmp; tmp = tmp->parent())
        if (tmp->attribute() == cali_class_aggregatable_attr_id && tmp->data() == Variant(true)) {
            prop |= CALI_ATTR_AGGREGATABLE;
            break;
        }

    Attribute name_attr = Attribute::make_attribute(sT->tree.node(Attribute::NAME_ATTR_ID));
    Attribute prop_attr = Attribute::make_attribute(sT->tree.node(Attribute::PROP_ATTR_ID));

    node = sT->tree.get_child(prop_attr, Variant(prop), node);
    node = sT->tree.get_child(name_attr, Variant(CALI_TYPE_STRING, name.data(), name.size()), node);

    {
        // Check again if attribute already exists; might have been created by
        // another thread in the meantime.
        // We've created some redundant nodes then, but that's fine

        std::lock_guard<std::mutex> ga(sG->attribute_lock);

        auto it = sG->attribute_map.lower_bound(name);

        if (it == sG->attribute_map.end() || it->first != name)
            sG->attribute_map.insert(it, std::make_pair(name, Attribute::make_attribute(node)));
        else
            return it->second;
    }

    // Create attribute object

    Attribute attr = Attribute::make_attribute(node);

    for (auto& channel : sG->all_channels)
        channel.mP->events.create_attr_evt(this, attr);

    return attr;
}